

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

pair<slang::parsing::Trivia,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handleMacroUsage
          (pair<slang::parsing::Trivia,_slang::parsing::Trivia> *__return_storage_ptr__,
          Preprocessor *this,Token directive)

{
  MacroUsageSyntax *syntax;
  Token directive_local;
  pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia> local_38;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  this->inMacroBody = true;
  handleTopLevelMacro(&local_38,this,directive);
  this->inMacroBody = false;
  syntax = BumpAllocator::
           emplace<slang::syntax::MacroUsageSyntax,slang::parsing::Token&,slang::syntax::MacroActualArgumentListSyntax*&>
                     (this->alloc,&directive_local,&local_38.first);
  Trivia::Trivia(&__return_storage_ptr__->first,Directive,(SyntaxNode *)syntax);
  (__return_storage_ptr__->second).field_0.rawText.ptr = local_38.second.field_0.rawText.ptr;
  *(undefined8 *)((long)&(__return_storage_ptr__->second).field_0 + 8) = local_38.second._8_8_;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Trivia, Trivia> Preprocessor::handleMacroUsage(Token directive) {
    // delegate to a nested function to simplify the error handling paths
    inMacroBody = true;
    auto [actualArgs, extraTrivia] = handleTopLevelMacro(directive);
    inMacroBody = false;

    auto syntax = alloc.emplace<MacroUsageSyntax>(directive, actualArgs);
    return std::make_pair(Trivia(TriviaKind::Directive, syntax), extraTrivia);
}